

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O1

void __thiscall
duckdb::OperatorProfiler::EndOperator
          (OperatorProfiler *this,optional_ptr<duckdb::DataChunk,_true> chunk)

{
  profiler_settings_t *settings;
  bool bVar1;
  int iVar2;
  OperatorInformation *pOVar3;
  long lVar4;
  idx_t iVar5;
  BufferManager *pBVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InternalException *this_00;
  optional_ptr<duckdb::DataChunk,_true> local_58;
  string local_50;
  
  if (this->enabled == true) {
    local_58.ptr = chunk.ptr;
    if ((this->active_operator).ptr == (PhysicalOperator *)0x0) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "OperatorProfiler: Attempting to call EndOperator while no operator is active","");
      InternalException::InternalException(this_00,&local_50);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((this->settings)._M_h._M_element_count != 0) {
      settings = &this->settings;
      optional_ptr<const_duckdb::PhysicalOperator,_true>::CheckValid(&this->active_operator);
      pOVar3 = GetOperatorInfo(this,(this->active_operator).ptr);
      bVar1 = ProfilingInfo::Enabled(settings,OPERATOR_TIMING);
      if (bVar1) {
        lVar4 = ::std::chrono::_V2::steady_clock::now();
        (this->op).end.__d.__r = lVar4;
        (this->op).finished = true;
        pOVar3->time = (double)(lVar4 - (this->op).start.__d.__r) / 1000000000.0 + pOVar3->time;
      }
      bVar1 = ProfilingInfo::Enabled(settings,OPERATOR_CARDINALITY);
      if ((bVar1) && (local_58.ptr != (DataChunk *)0x0)) {
        optional_ptr<duckdb::DataChunk,_true>::CheckValid(&local_58);
        pOVar3->elements_returned = pOVar3->elements_returned + (local_58.ptr)->count;
      }
      bVar1 = ProfilingInfo::Enabled(settings,RESULT_SET_SIZE);
      if ((bVar1) && (local_58.ptr != (DataChunk *)0x0)) {
        optional_ptr<duckdb::DataChunk,_true>::CheckValid(&local_58);
        iVar5 = DataChunk::GetAllocationSize(local_58.ptr);
        pOVar3->result_set_size = pOVar3->result_set_size + iVar5;
      }
      bVar1 = ProfilingInfo::Enabled(settings,SYSTEM_PEAK_BUFFER_MEMORY);
      if (bVar1) {
        pBVar6 = BufferManager::GetBufferManager(this->context);
        iVar2 = (*pBVar6->_vptr_BufferManager[0x1f])(pBVar6);
        iVar5 = BufferPool::GetUsedMemory((BufferPool *)CONCAT44(extraout_var,iVar2),false);
        if (pOVar3->system_peak_buffer_manager_memory < iVar5) {
          pOVar3->system_peak_buffer_manager_memory = iVar5;
        }
      }
      bVar1 = ProfilingInfo::Enabled(settings,SYSTEM_PEAK_TEMP_DIR_SIZE);
      if (bVar1) {
        pBVar6 = BufferManager::GetBufferManager(this->context);
        iVar2 = (*pBVar6->_vptr_BufferManager[0xc])(pBVar6);
        if (pOVar3->system_peak_temp_directory_size < CONCAT44(extraout_var_00,iVar2)) {
          pOVar3->system_peak_temp_directory_size = CONCAT44(extraout_var_00,iVar2);
        }
      }
    }
    (this->active_operator).ptr = (PhysicalOperator *)0x0;
  }
  return;
}

Assistant:

void OperatorProfiler::EndOperator(optional_ptr<DataChunk> chunk) {
	if (!enabled) {
		return;
	}
	if (!active_operator) {
		throw InternalException("OperatorProfiler: Attempting to call EndOperator while no operator is active");
	}

	if (!settings.empty()) {
		auto &info = GetOperatorInfo(*active_operator);
		if (ProfilingInfo::Enabled(settings, MetricsType::OPERATOR_TIMING)) {
			op.End();
			info.AddTime(op.Elapsed());
		}
		if (ProfilingInfo::Enabled(settings, MetricsType::OPERATOR_CARDINALITY) && chunk) {
			info.AddReturnedElements(chunk->size());
		}
		if (ProfilingInfo::Enabled(settings, MetricsType::RESULT_SET_SIZE) && chunk) {
			auto result_set_size = chunk->GetAllocationSize();
			info.AddResultSetSize(result_set_size);
		}
		if (ProfilingInfo::Enabled(settings, MetricsType::SYSTEM_PEAK_BUFFER_MEMORY)) {
			auto used_memory = BufferManager::GetBufferManager(context).GetBufferPool().GetUsedMemory(false);
			info.UpdateSystemPeakBufferManagerMemory(used_memory);
		}
		if (ProfilingInfo::Enabled(settings, MetricsType::SYSTEM_PEAK_TEMP_DIR_SIZE)) {
			auto used_swap = BufferManager::GetBufferManager(context).GetUsedSwap();
			info.UpdateSystemPeakTempDirectorySize(used_swap);
		}
	}
	active_operator = nullptr;
}